

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

int tdefl_flush_block(tdefl_compressor *d,int flush)

{
  undefined4 uVar1;
  undefined1 *puVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  int in_ESI;
  long *in_RDI;
  int bytes_to_copy;
  mz_uint len_11;
  mz_uint bits_11;
  mz_uint len_10;
  mz_uint bits_10;
  mz_uint len_9;
  mz_uint bits_9;
  mz_uint z;
  mz_uint i_2;
  mz_uint len_8;
  mz_uint bits_8;
  mz_uint a;
  mz_uint i_1;
  mz_uint len_7;
  mz_uint bits_7;
  mz_uint len_6;
  mz_uint bits_6;
  mz_uint len_5;
  mz_uint bits_5;
  mz_uint len_4;
  mz_uint bits_4;
  mz_uint len_3;
  mz_uint bits_3;
  mz_uint i;
  mz_uint len_2;
  mz_uint bits_2;
  mz_uint len_1;
  mz_uint bits_1;
  mz_uint len;
  mz_uint bits;
  mz_uint8 *pOutput_buf_start;
  int use_raw_block;
  int n;
  mz_bool comp_block_succeeded;
  mz_uint8 *pSaved_output_buf;
  mz_uint saved_bits_in;
  mz_uint saved_bit_buf;
  mz_bool in_stack_ffffffffffffff1c;
  int iVar7;
  tdefl_compressor *in_stack_ffffffffffffff20;
  long local_c8;
  uint local_9c;
  int local_98;
  uint local_8c;
  uint local_88;
  uint local_5c;
  int local_2c;
  
  local_2c = 0;
  bVar4 = false;
  if ((*(uint *)(in_RDI + 2) & 0x80000) != 0) {
    bVar4 = (uint)(*(int *)((long)in_RDI + 0x24) - (int)in_RDI[0xb]) <=
            *(uint *)((long)in_RDI + 0x2c);
  }
  if ((*in_RDI == 0) && (0x14ccb < (ulong)(*(long *)in_RDI[0x14] - in_RDI[0x18]))) {
    local_c8 = in_RDI[0x12] + in_RDI[0x18];
  }
  else {
    local_c8 = (long)in_RDI + 0x392aa;
  }
  in_RDI[8] = local_c8;
  in_RDI[9] = in_RDI[8] + 0x14cbc;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  *(undefined4 *)((long)in_RDI + 0x74) = 0;
  *(char *)in_RDI[7] = (char)((int)(uint)*(byte *)in_RDI[7] >> ((byte)(int)in_RDI[10] & 0x1f));
  in_RDI[6] = in_RDI[6] - (long)(int)(uint)((int)in_RDI[10] == 8);
  if (((*(uint *)(in_RDI + 2) & 0x1000) != 0) && (*(int *)((long)in_RDI + 0x7c) == 0)) {
    *(uint *)(in_RDI + 0xc) =
         0x78 << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
    *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 8;
    while (7 < *(uint *)((long)in_RDI + 0x5c)) {
      if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
        puVar2 = (undefined1 *)in_RDI[8];
        in_RDI[8] = (long)(puVar2 + 1);
        *puVar2 = (char)(int)in_RDI[0xc];
      }
      *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
      *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
    }
    *(uint *)(in_RDI + 0xc) =
         1 << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
    *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 8;
    while (7 < *(uint *)((long)in_RDI + 0x5c)) {
      if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
        puVar2 = (undefined1 *)in_RDI[8];
        in_RDI[8] = (long)(puVar2 + 1);
        *puVar2 = (char)(int)in_RDI[0xc];
      }
      *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
      *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
    }
  }
  *(uint *)(in_RDI + 0xc) =
       (uint)(in_ESI == 4) << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) |
       *(uint *)(in_RDI + 0xc);
  *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 1;
  while (7 < *(uint *)((long)in_RDI + 0x5c)) {
    if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
      puVar2 = (undefined1 *)in_RDI[8];
      in_RDI[8] = (long)(puVar2 + 1);
      *puVar2 = (char)(int)in_RDI[0xc];
    }
    *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
    *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
  }
  lVar3 = in_RDI[8];
  lVar5 = in_RDI[0xc];
  uVar1 = *(undefined4 *)((long)in_RDI + 0x5c);
  if (((bVar4) ||
      ((local_2c = tdefl_compress_block(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c),
       *(int *)((long)in_RDI + 0x54) != 0 &&
       ((long)(ulong)*(uint *)((long)in_RDI + 0x54) <= (in_RDI[8] - lVar3) + 1)))) &&
     ((uint)(*(int *)((long)in_RDI + 0x24) - (int)in_RDI[0xb]) <= *(uint *)((long)in_RDI + 0x2c))) {
    in_RDI[8] = lVar3;
    *(int *)(in_RDI + 0xc) = (int)lVar5;
    *(undefined4 *)((long)in_RDI + 0x5c) = uVar1;
    *(uint *)(in_RDI + 0xc) =
         0 << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
    *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 2;
    while (7 < *(uint *)((long)in_RDI + 0x5c)) {
      if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
        puVar2 = (undefined1 *)in_RDI[8];
        in_RDI[8] = (long)(puVar2 + 1);
        *puVar2 = (char)(int)in_RDI[0xc];
      }
      *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
      *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
    }
    if (*(int *)((long)in_RDI + 0x5c) != 0) {
      *(uint *)(in_RDI + 0xc) =
           0 << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
      *(int *)((long)in_RDI + 0x5c) =
           (8 - *(int *)((long)in_RDI + 0x5c)) + *(int *)((long)in_RDI + 0x5c);
      while (7 < *(uint *)((long)in_RDI + 0x5c)) {
        if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
          puVar2 = (undefined1 *)in_RDI[8];
          in_RDI[8] = (long)(puVar2 + 1);
          *puVar2 = (char)(int)in_RDI[0xc];
        }
        *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
        *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
      }
    }
    local_5c = 2;
    while (local_5c != 0) {
      *(uint *)(in_RDI + 0xc) =
           (*(uint *)((long)in_RDI + 0x54) & 0xffff) <<
           ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
      *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 0x10;
      while (7 < *(uint *)((long)in_RDI + 0x5c)) {
        if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
          puVar2 = (undefined1 *)in_RDI[8];
          in_RDI[8] = (long)(puVar2 + 1);
          *puVar2 = (char)(int)in_RDI[0xc];
        }
        *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
        *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
      }
      local_5c = local_5c + -1;
      *(uint *)((long)in_RDI + 0x54) = *(uint *)((long)in_RDI + 0x54) ^ 0xffff;
    }
    for (local_5c = 0; local_5c < *(uint *)((long)in_RDI + 0x54); local_5c = local_5c + 1) {
      *(uint *)(in_RDI + 0xc) =
           (uint)*(byte *)((long)in_RDI + (ulong)((int)in_RDI[0xb] + local_5c & 0x7fff) + 200) <<
           ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
      *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 8;
      while (7 < *(uint *)((long)in_RDI + 0x5c)) {
        if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
          puVar2 = (undefined1 *)in_RDI[8];
          in_RDI[8] = (long)(puVar2 + 1);
          *puVar2 = (char)(int)in_RDI[0xc];
        }
        *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
        *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
      }
    }
  }
  else if (local_2c == 0) {
    in_RDI[8] = lVar3;
    *(int *)(in_RDI + 0xc) = (int)lVar5;
    *(undefined4 *)((long)in_RDI + 0x5c) = uVar1;
    tdefl_compress_block(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  }
  if (in_ESI != 0) {
    if (in_ESI == 4) {
      if (*(int *)((long)in_RDI + 0x5c) != 0) {
        *(uint *)(in_RDI + 0xc) =
             0 << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
        *(int *)((long)in_RDI + 0x5c) =
             (8 - *(int *)((long)in_RDI + 0x5c)) + *(int *)((long)in_RDI + 0x5c);
        while (7 < *(uint *)((long)in_RDI + 0x5c)) {
          if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
            puVar2 = (undefined1 *)in_RDI[8];
            in_RDI[8] = (long)(puVar2 + 1);
            *puVar2 = (char)(int)in_RDI[0xc];
          }
          *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
          *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
        }
      }
      if ((*(uint *)(in_RDI + 2) & 0x1000) != 0) {
        local_8c = *(uint *)(in_RDI + 4);
        for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
          *(uint *)(in_RDI + 0xc) =
               (local_8c >> 0x18) << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) |
               *(uint *)(in_RDI + 0xc);
          *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 8;
          while (7 < *(uint *)((long)in_RDI + 0x5c)) {
            if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
              puVar2 = (undefined1 *)in_RDI[8];
              in_RDI[8] = (long)(puVar2 + 1);
              *puVar2 = (char)(int)in_RDI[0xc];
            }
            *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
            *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
          }
          local_8c = local_8c << 8;
        }
      }
    }
    else {
      local_9c = 0;
      *(uint *)(in_RDI + 0xc) =
           0 << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
      *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 3;
      while (7 < *(uint *)((long)in_RDI + 0x5c)) {
        if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
          puVar2 = (undefined1 *)in_RDI[8];
          in_RDI[8] = (long)(puVar2 + 1);
          *puVar2 = (char)(int)in_RDI[0xc];
        }
        *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
        *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
      }
      if (*(int *)((long)in_RDI + 0x5c) != 0) {
        *(uint *)(in_RDI + 0xc) =
             0 << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0xc);
        *(int *)((long)in_RDI + 0x5c) =
             (8 - *(int *)((long)in_RDI + 0x5c)) + *(int *)((long)in_RDI + 0x5c);
        while (7 < *(uint *)((long)in_RDI + 0x5c)) {
          if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
            puVar2 = (undefined1 *)in_RDI[8];
            in_RDI[8] = (long)(puVar2 + 1);
            *puVar2 = (char)(int)in_RDI[0xc];
          }
          *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
          *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
        }
      }
      for (local_98 = 2; local_98 != 0; local_98 = local_98 + -1) {
        *(uint *)(in_RDI + 0xc) =
             local_9c << ((byte)*(undefined4 *)((long)in_RDI + 0x5c) & 0x1f) |
             *(uint *)(in_RDI + 0xc);
        *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 0x10;
        while (7 < *(uint *)((long)in_RDI + 0x5c)) {
          if ((ulong)in_RDI[8] < (ulong)in_RDI[9]) {
            puVar2 = (undefined1 *)in_RDI[8];
            in_RDI[8] = (long)(puVar2 + 1);
            *puVar2 = (char)(int)in_RDI[0xc];
          }
          *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) >> 8;
          *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + -8;
        }
        local_9c = local_9c ^ 0xffff;
      }
    }
  }
  memset((void *)((long)in_RDI + 0x81ca),0,0x240);
  memset((void *)((long)in_RDI + 0x840a),0,0x40);
  in_RDI[6] = (long)in_RDI + 0x92ab;
  in_RDI[7] = (long)in_RDI + 0x92aa;
  *(undefined4 *)(in_RDI + 10) = 8;
  *(int *)(in_RDI + 0xb) = *(int *)((long)in_RDI + 0x54) + (int)in_RDI[0xb];
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(int *)((long)in_RDI + 0x7c) = *(int *)((long)in_RDI + 0x7c) + 1;
  iVar6 = (int)in_RDI[8] - (int)local_c8;
  if (iVar6 != 0) {
    if (*in_RDI == 0) {
      if (local_c8 == (long)in_RDI + 0x392aa) {
        iVar7 = iVar6;
        if ((ulong)(*(long *)in_RDI[0x14] - in_RDI[0x18]) <= (ulong)(long)iVar6) {
          iVar7 = (int)*(undefined8 *)in_RDI[0x14] - (int)in_RDI[0x18];
        }
        memcpy((void *)(in_RDI[0x12] + in_RDI[0x18]),(void *)((long)in_RDI + 0x392aa),(long)iVar7);
        in_RDI[0x18] = (long)iVar7 + in_RDI[0x18];
        if (iVar6 - iVar7 != 0) {
          *(int *)(in_RDI + 0xe) = iVar7;
          *(int *)((long)in_RDI + 0x74) = iVar6 - iVar7;
        }
      }
      else {
        in_RDI[0x18] = (long)iVar6 + in_RDI[0x18];
      }
    }
    else {
      *(long *)in_RDI[0x13] = in_RDI[0x16] - in_RDI[0x11];
      iVar6 = (*(code *)*in_RDI)((long)in_RDI + 0x392aa,iVar6,in_RDI[1]);
      if (iVar6 == 0) {
        *(undefined4 *)((long)in_RDI + 0x84) = 0xffffffff;
        return -1;
      }
    }
  }
  return *(int *)((long)in_RDI + 0x74);
}

Assistant:

static int tdefl_flush_block(tdefl_compressor* d, int flush) {
  mz_uint saved_bit_buf, saved_bits_in;
  mz_uint8* pSaved_output_buf;
  mz_bool comp_block_succeeded = MZ_FALSE;
  int n, use_raw_block = ((d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS) != 0) && (d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size;
  mz_uint8* pOutput_buf_start = ((d->m_pPut_buf_func == NULL) && ((*d->m_pOut_buf_size - d->m_out_buf_ofs) >= TDEFL_OUT_BUF_SIZE)) ? ((mz_uint8*)d->m_pOut_buf + d->m_out_buf_ofs) : d->m_output_buf;

  d->m_pOutput_buf = pOutput_buf_start;
  d->m_pOutput_buf_end = d->m_pOutput_buf + TDEFL_OUT_BUF_SIZE - 16;

  MZ_ASSERT(!d->m_output_flush_remaining);
  d->m_output_flush_ofs = 0;
  d->m_output_flush_remaining = 0;

  *d->m_pLZ_flags = (mz_uint8)(*d->m_pLZ_flags >> d->m_num_flags_left);
  d->m_pLZ_code_buf -= (d->m_num_flags_left == 8);

  if ((d->m_flags & TDEFL_WRITE_ZLIB_HEADER) && (!d->m_block_index)) {
    TDEFL_PUT_BITS(0x78, 8);
    TDEFL_PUT_BITS(0x01, 8);
  }

  TDEFL_PUT_BITS(flush == TDEFL_FINISH, 1);

  pSaved_output_buf = d->m_pOutput_buf;
  saved_bit_buf = d->m_bit_buffer;
  saved_bits_in = d->m_bits_in;

  if (!use_raw_block)
    comp_block_succeeded = tdefl_compress_block(d, (d->m_flags & TDEFL_FORCE_ALL_STATIC_BLOCKS) || (d->m_total_lz_bytes < 48));

  // If the block gets expanded, forget the current contents of the output buffer and send a raw block instead.
  if (((use_raw_block) || ((d->m_total_lz_bytes) && ((d->m_pOutput_buf - pSaved_output_buf + 1U) >= d->m_total_lz_bytes))) &&
      ((d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size)) {
    mz_uint i;
    d->m_pOutput_buf = pSaved_output_buf;
    d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
    TDEFL_PUT_BITS(0, 2);
    if (d->m_bits_in) {
      TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
    }
    for (i = 2; i; --i, d->m_total_lz_bytes ^= 0xFFFF) {
      TDEFL_PUT_BITS(d->m_total_lz_bytes & 0xFFFF, 16);
    }
    for (i = 0; i < d->m_total_lz_bytes; ++i) {
      TDEFL_PUT_BITS(d->m_dict[(d->m_lz_code_buf_dict_pos + i) & TDEFL_LZ_DICT_SIZE_MASK], 8);
    }
  }
  // Check for the extremely unlikely (if not impossible) case of the compressed block not fitting into the output buffer when using dynamic codes.
  else if (!comp_block_succeeded) {
    d->m_pOutput_buf = pSaved_output_buf;
    d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
    tdefl_compress_block(d, MZ_TRUE);
  }

  if (flush) {
    if (flush == TDEFL_FINISH) {
      if (d->m_bits_in) {
        TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
      }
      if (d->m_flags & TDEFL_WRITE_ZLIB_HEADER) {
        mz_uint i, a = d->m_adler32;
        for (i = 0; i < 4; i++) {
          TDEFL_PUT_BITS((a >> 24) & 0xFF, 8);
          a <<= 8;
        }
      }
    } else {
      mz_uint i, z = 0;
      TDEFL_PUT_BITS(0, 3);
      if (d->m_bits_in) {
        TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
      }
      for (i = 2; i; --i, z ^= 0xFFFF) {
        TDEFL_PUT_BITS(z & 0xFFFF, 16);
      }
    }
  }

  MZ_ASSERT(d->m_pOutput_buf < d->m_pOutput_buf_end);

  memset(&d->m_huff_count[0][0], 0, sizeof(d->m_huff_count[0][0]) * TDEFL_MAX_HUFF_SYMBOLS_0);
  memset(&d->m_huff_count[1][0], 0, sizeof(d->m_huff_count[1][0]) * TDEFL_MAX_HUFF_SYMBOLS_1);

  d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
  d->m_pLZ_flags = d->m_lz_code_buf;
  d->m_num_flags_left = 8;
  d->m_lz_code_buf_dict_pos += d->m_total_lz_bytes;
  d->m_total_lz_bytes = 0;
  d->m_block_index++;

  if ((n = (int)(d->m_pOutput_buf - pOutput_buf_start)) != 0) {
    if (d->m_pPut_buf_func) {
      *d->m_pIn_buf_size = d->m_pSrc - (const mz_uint8*)d->m_pIn_buf;
      if (!(*d->m_pPut_buf_func)(d->m_output_buf, n, d->m_pPut_buf_user))
        return (d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED);
    } else if (pOutput_buf_start == d->m_output_buf) {
      int bytes_to_copy = (int)MZ_MIN((size_t)n, (size_t)(*d->m_pOut_buf_size - d->m_out_buf_ofs));
      memcpy((mz_uint8*)d->m_pOut_buf + d->m_out_buf_ofs, d->m_output_buf, bytes_to_copy);
      d->m_out_buf_ofs += bytes_to_copy;
      if ((n -= bytes_to_copy) != 0) {
        d->m_output_flush_ofs = bytes_to_copy;
        d->m_output_flush_remaining = n;
      }
    } else {
      d->m_out_buf_ofs += n;
    }
  }

  return d->m_output_flush_remaining;
}